

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O3

FILE * Minisat::open_pipe(char *fmt,char *path,char *mode)

{
  bool bVar1;
  char *__dest;
  size_t sVar2;
  FILE *pFVar3;
  int *piVar4;
  undefined8 uVar5;
  size_t sVar6;
  
  for (sVar6 = 0; (fmt[sVar6] & 0xdfU) != 0; sVar6 = sVar6 + 1) {
  }
  __dest = (char *)malloc(sVar6 + 1);
  if (__dest == (char *)0x0) {
LAB_00108ab9:
    piVar4 = __errno_location();
    if (*piVar4 == 0xc) {
      uVar5 = __cxa_allocate_exception(1);
      __cxa_throw(uVar5,&OutOfMemoryException::typeinfo,0);
    }
    pFVar3 = (FILE *)0x0;
  }
  else {
    strncpy(__dest,fmt,sVar6);
    __dest[sVar6] = '\0';
    bVar1 = find_executable(__dest);
    if (bVar1) {
      free(__dest);
      sVar6 = strlen(fmt);
      sVar2 = strlen(path);
      __dest = (char *)malloc(sVar6 + sVar2 + 1);
      if (__dest == (char *)0x0) goto LAB_00108ab9;
      sprintf(__dest,fmt,path);
      pFVar3 = popen(__dest,mode);
    }
    else {
      pFVar3 = (FILE *)0x0;
      fprintf(_stderr,"c WARNING: failed to find executable %s\n",__dest);
    }
    free(__dest);
  }
  return (FILE *)pFVar3;
}

Assistant:

inline FILE *open_pipe(const char *fmt, const char *path, const char *mode)
{
    size_t name_len = 0;
    while (fmt[name_len] && fmt[name_len] != ' ') name_len++;
    char *name = (char *)xrealloc(NULL, name_len + 1);
    if (!name) return 0;
    strncpy(name, fmt, name_len);
    name[name_len] = 0;
    bool found = find_executable(name);
    if (!found) fprintf(stderr, "c WARNING: failed to find executable %s\n", name);
    free(name);
    if (!found) return 0;
    char *cmd = (char *)xrealloc(NULL, strlen(fmt) + strlen(path) + 1);
    if (!cmd) return 0;
    sprintf(cmd, fmt, path);
    FILE *res = popen(cmd, mode);
    free(cmd);
    return res;
}